

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O3

int lib::string::Char(State *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ValueT VVar3;
  int index;
  StackAPI api;
  string str;
  StackAPI SStack_58;
  string local_48;
  
  luna::StackAPI::StackAPI(&SStack_58,state);
  iVar2 = luna::StackAPI::GetStackSize(&SStack_58);
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (0 < iVar2) {
    index = 0;
    do {
      VVar3 = luna::StackAPI::GetValueType(&SStack_58,index);
      if (VVar3 != ValueT_Number) {
        iVar2 = 0;
        luna::StackAPI::ArgTypeError(&SStack_58,index,ValueT_Number);
        goto LAB_00122835;
      }
      luna::StackAPI::GetNumber(&SStack_58,index);
      std::__cxx11::string::push_back((char)&local_48);
      index = index + 1;
    } while (iVar2 != index);
  }
  iVar2 = 1;
  luna::StackAPI::PushString(&SStack_58,&local_48);
LAB_00122835:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

int Char(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        std::string str;
        for (int i = 0; i < params; ++i)
        {
            if (!api.IsNumber(i))
            {
                api.ArgTypeError(i, luna::ValueT_Number);
                return 0;
            }
            else
            {
                str.push_back(static_cast<int>(api.GetNumber(i)));
            }
        }

        api.PushString(str);
        return 1;
    }